

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,REF_INT keep,REF_INT lose)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_ADJ ref_adj;
  REF_GLOB *pRVar3;
  REF_ADJ pRVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  REF_INT node;
  char *pcVar9;
  ulong uVar10;
  long local_40;
  
  if (-1 < keep) {
    pRVar1 = ref_migrate->grid->node;
    if ((keep < pRVar1->max) && (pRVar2 = pRVar1->global, -1 < pRVar2[(uint)keep])) {
      if (((-1 < lose) && (lose < pRVar1->max)) && (-1 < pRVar2[(uint)lose])) {
        ref_adj = ref_migrate->conn;
        pRVar3 = ref_migrate->global;
        pRVar3[(uint)lose] = -1;
        pRVar4 = ref_migrate->parent_local;
        if ((keep < pRVar4->nnode) && (lVar7 = (long)pRVar4->first[(uint)keep], lVar7 != -1)) {
          lVar6 = -1;
          if (-1 < pRVar2[(uint)lose]) {
            lVar6 = pRVar2[(uint)lose];
          }
          if (pRVar3[pRVar4->item[lVar7].ref] == lVar6) {
            return 0;
          }
          while (lVar7 = (long)pRVar4->item[(int)lVar7].next, lVar7 != -1) {
            if (pRVar3[pRVar4->item[lVar7].ref] == lVar6) {
              return 0;
            }
          }
        }
        if ((lose < ref_adj->nnode) && (local_40 = (long)ref_adj->first[(uint)lose], local_40 != -1)
           ) {
          node = ref_adj->item[local_40].ref;
          while (uVar5 = ref_adj_remove(ref_adj,node,lose), uVar5 == 0) {
            if (node != keep) {
              uVar5 = ref_adj_add_uniquely(ref_adj,node,keep);
              if (uVar5 != 0) {
                uVar10 = (ulong)uVar5;
                pcVar9 = "add to keep";
                uVar8 = 199;
                goto LAB_001fa0ee;
              }
              uVar5 = ref_adj_add_uniquely(ref_adj,keep,node);
              if (uVar5 != 0) {
                uVar10 = (ulong)uVar5;
                pcVar9 = "add to keep";
                uVar8 = 200;
                goto LAB_001fa0ee;
              }
            }
            local_40 = (long)ref_adj->item[(int)local_40].next;
            if (local_40 == -1) goto LAB_001f9feb;
            node = ref_adj->item[local_40].ref;
          }
          uVar10 = (ulong)uVar5;
          pcVar9 = "rm to lose";
          uVar8 = 0xc5;
        }
        else {
LAB_001f9feb:
          do {
            if ((ref_adj->nnode <= lose) || ((long)ref_adj->first[(uint)lose] == -1)) {
              if (ref_migrate->global[(uint)keep] == -1) {
                return 0;
              }
              ref_migrate->xyz[(ulong)(uint)(keep * 3) + 1] = 0.5;
              ref_migrate->weight[(uint)keep] = 2.0;
              uVar5 = ref_adj_add(ref_migrate->parent_local,keep,lose);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0xda,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add");
                return uVar5;
              }
              uVar5 = ref_adj_add(ref_migrate->parent_part,keep,pRVar1->part[(uint)lose]);
              if (uVar5 == 0) {
                return 0;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0xdd,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add");
              return uVar5;
            }
            uVar5 = ref_adj_remove(ref_adj,lose,ref_adj->item[ref_adj->first[(uint)lose]].ref);
          } while (uVar5 == 0);
          uVar10 = (ulong)uVar5;
          pcVar9 = "rm from lose";
          uVar8 = 0xd1;
        }
LAB_001fa0ee:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               uVar8,"ref_migrate_2d_agglomeration_keep",uVar10,pcVar9);
        return (REF_STATUS)uVar10;
      }
      pcVar9 = "lose node invalid";
      uVar8 = 0xb7;
      goto LAB_001f9efb;
    }
  }
  pcVar9 = "keep node invalid";
  uVar8 = 0xb6;
LAB_001f9efb:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar8,
         "ref_migrate_2d_agglomeration_keep",pcVar9);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,
                                                     REF_INT keep,
                                                     REF_INT lose) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_ADJ conn_adj = ref_migrate_conn(ref_migrate);
  REF_INT item, local;
  REF_GLOB global;
  REF_INT from_node;

  /* not working for general agglomeration, ghost lose? */

  RAS(ref_node_valid(ref_node, keep), "keep node invalid");
  RAS(ref_node_valid(ref_node, lose), "lose node invalid");

  ref_migrate_global(ref_migrate, lose) = REF_EMPTY;

  /* skip if the lose node has been agglomerated */
  each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), keep,
                                  item, local) {
    global = ref_migrate_global(ref_migrate, local);
    if (global == ref_node_global(ref_node, lose)) {
      return REF_SUCCESS;
    }
  }
  /* update edges pointing to lose node */
  each_ref_adj_node_item_with_ref(conn_adj, lose, item, from_node) {
    RSS(ref_adj_remove(conn_adj, from_node, lose), "rm to lose");
    if (from_node != keep) {
      RSS(ref_adj_add_uniquely(conn_adj, from_node, keep), "add to keep");
      RSS(ref_adj_add_uniquely(conn_adj, keep, from_node), "add to keep");
    }
  }

  /* update edges pointing from lose node */
  while (ref_adj_valid(ref_adj_first(conn_adj, lose))) {
    RSS(ref_adj_remove(
            conn_adj, lose,
            ref_adj_item_ref(conn_adj, ref_adj_first(conn_adj, lose))),
        "rm from lose");
  }

  /* skip if keep node is off-proc or already agglomerated */
  if (!ref_migrate_valid(ref_migrate, keep)) return REF_SUCCESS;

  ref_migrate_xyz(ref_migrate, 1, keep) = 0.5;
  ref_migrate_weight(ref_migrate, keep) = 2.0;
  /* collect age in general case */
  RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), keep, lose), "add");
  RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), keep,
                  ref_node_part(ref_node, lose)),
      "add");

  return REF_SUCCESS;
}